

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(BlockManager *this)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  set<int,_std::less<int>,_std::allocator<int>_> block_files_to_prune;
  int local_5c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&this->cs_LastBlockFile,
             "cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x233,false);
  iVar1 = 0;
  if ((this->m_blockfile_cursors)._M_elems[0].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
    iVar1 = (this->m_blockfile_cursors)._M_elems[0].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  }
  if ((this->m_blockfile_cursors)._M_elems[1].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
    iVar2 = (this->m_blockfile_cursors)._M_elems[1].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  }
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_58);
  if (this->m_have_pruned == true) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
      if ((this->m_blockfile_info).
          super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
          super__Vector_impl_data._M_start[local_5c].nSize == 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_58,&local_5c);
      }
    }
    UnlinkPrunedFiles(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_58);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::ScanAndUnlinkAlreadyPrunedFiles()
{
    AssertLockHeld(::cs_main);
    int max_blockfile = WITH_LOCK(cs_LastBlockFile, return this->MaxBlockfileNum());
    if (!m_have_pruned) {
        return;
    }

    std::set<int> block_files_to_prune;
    for (int file_number = 0; file_number < max_blockfile; file_number++) {
        if (m_blockfile_info[file_number].nSize == 0) {
            block_files_to_prune.insert(file_number);
        }
    }

    UnlinkPrunedFiles(block_files_to_prune);
}